

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int push_all(mg_context *ctx,FILE *fp,SOCKET sock,SSL *ssl,char *buf,int len)

{
  char *__nptr;
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  undefined4 in_register_00000014;
  int iVar5;
  size_t __n;
  stop_flag_t *stop_flag;
  uint uVar6;
  SSL *__buf;
  timespec tsnow;
  timespec local_78;
  int local_64;
  ulong local_60;
  long local_58;
  double local_50;
  ulong local_48;
  SSL *local_40;
  long local_38;
  
  local_38 = CONCAT44(in_register_00000014,sock);
  if (ctx == (mg_context *)0x0) {
    uVar6 = 0xffffffff;
  }
  else {
    __n = (ulong)buf & 0xffffffff;
    __nptr = (ctx->dd).config[0xb];
    local_40 = ssl;
    if (__nptr == (char *)0x0) {
      local_50 = -1.0;
    }
    else {
      iVar2 = atoi(__nptr);
      local_50 = (double)iVar2 / 1000.0;
    }
    if (local_50 <= 0.0) {
      local_50 = strtod("30000",(char **)0x0);
      local_50 = local_50 / 1000.0;
    }
    if ((int)buf < 1) {
      uVar6 = 0;
    }
    else {
      stop_flag = &ctx->stop_flag;
      local_48 = (ulong)(local_50 * 1000000000.0);
      local_48 = (long)(local_50 * 1000000000.0 - 9.223372036854776e+18) & (long)local_48 >> 0x3f |
                 local_48;
      uVar6 = 0;
      do {
        if (*stop_flag != 0) {
          return uVar6;
        }
        if (local_50 <= 0.0) {
          local_60 = 0;
          local_58 = 0;
        }
        else {
          clock_gettime(0,&local_78);
          local_58 = CONCAT26(local_78.tv_sec._6_2_,
                              CONCAT24(local_78.tv_sec._4_2_,(int)local_78.tv_sec)) * -1000000000 -
                     local_78.tv_nsec;
          local_60 = local_48;
        }
        local_64 = (int)__n;
        if (local_38 == 0) {
          __buf = local_40 + uVar6;
          do {
            do {
              sVar3 = send((int)fp,__buf,__n,0x4000);
              iVar5 = (int)sVar3;
              iVar2 = 0;
              if (iVar5 < 0) {
                piVar4 = __errno_location();
                iVar2 = *piVar4;
              }
              if ((iVar2 == 0xb) || (iVar2 == 4)) {
                iVar5 = 0;
              }
              if ((iVar5 < 0) || (*stop_flag != 0)) goto LAB_0010e00a;
              if (iVar5 != 0) goto LAB_0010e00f;
              local_78.tv_sec._4_2_ = 4;
              local_78.tv_sec._0_4_ = (int)fp;
              iVar2 = mg_poll((pollfd *)&local_78,1,200,stop_flag);
              cVar1 = (0 < iVar2) * '\x03';
              if (*stop_flag != 0) {
                cVar1 = '\x01';
              }
            } while (cVar1 == '\x03');
            if (cVar1 != '\0') goto LAB_0010e00a;
          } while ((local_50 <= 0.0) ||
                  (clock_gettime(0,&local_78),
                  (ulong)(local_78.tv_nsec + local_58 +
                         CONCAT26(local_78.tv_sec._6_2_,
                                  CONCAT24(local_78.tv_sec._4_2_,(int)local_78.tv_sec)) * 1000000000
                         ) <= local_60));
          iVar5 = -1;
        }
        else {
LAB_0010e00a:
          iVar5 = -2;
        }
LAB_0010e00f:
        if (iVar5 < 0) {
          return -(uint)(uVar6 == 0) | uVar6;
        }
        uVar6 = uVar6 + iVar5;
        __n = (size_t)(uint)(local_64 - iVar5);
      } while (local_64 - iVar5 != 0 && iVar5 <= local_64);
    }
  }
  return uVar6;
}

Assistant:

static int
push_all(struct mg_context *ctx,
         FILE *fp,
         SOCKET sock,
         SSL *ssl,
         const char *buf,
         int len)
{
	double timeout = -1.0;
	int n, nwritten = 0;

	if (ctx == NULL) {
		return -1;
	}

	if (ctx->dd.config[REQUEST_TIMEOUT]) {
		timeout = atoi(ctx->dd.config[REQUEST_TIMEOUT]) / 1000.0;
	}
	if (timeout <= 0.0) {
		timeout = strtod(config_options[REQUEST_TIMEOUT].default_value, NULL)
		          / 1000.0;
	}

	while ((len > 0) && STOP_FLAG_IS_ZERO(&ctx->stop_flag)) {
		n = push_inner(ctx, fp, sock, ssl, buf + nwritten, len, timeout);
		if (n < 0) {
			if (nwritten == 0) {
				nwritten = -1; /* Propagate the error */
			}
			break;
		} else if (n == 0) {
			break; /* No more data to write */
		} else {
			nwritten += n;
			len -= n;
		}
	}

	return nwritten;
}